

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O1

base_learner * active_cover_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  vw *all_00;
  int iVar2;
  active_cover *dat;
  option_group_definition *poVar3;
  typed_option<float> *ptVar4;
  _func_int ***__dest;
  typed_option<unsigned_long> *ptVar5;
  base_learner *l;
  single_learner *base;
  float *pfVar6;
  ulong uVar7;
  learner<active_cover,_example> *plVar8;
  vw_exception *pvVar9;
  ulong uVar10;
  bool active_cover_option;
  size_type __dnew_6;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_5;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_ad1;
  options_i *local_ad0;
  size_t *local_ac8;
  _func_int ***local_ac0;
  _func_int **local_ab8;
  _func_int **local_ab0 [2];
  vw *local_aa0;
  long local_a98;
  _func_int ***local_a90;
  _func_int **local_a88;
  _func_int **local_a80 [2];
  _func_int ***local_a70;
  _func_int **local_a68;
  _func_int **local_a60 [2];
  _func_int ***local_a50;
  _func_int **local_a48;
  _func_int **local_a40 [2];
  _func_int ***local_a30;
  _func_int **local_a28;
  _func_int **local_a20 [2];
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  option_group_definition local_970;
  long *local_938;
  long local_930;
  long local_928 [2];
  _func_int ***local_918;
  _func_int **local_910;
  _func_int **local_908 [2];
  string local_8f8;
  string local_8d8;
  string local_8b8;
  undefined1 local_898 [20];
  undefined2 local_884;
  undefined1 local_882;
  string local_868 [64];
  bool local_828;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_810;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_800;
  undefined1 local_710 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  typed_option<unsigned_long> local_670;
  typed_option<float> local_5d0;
  typed_option<float> local_530;
  typed_option<float> local_490;
  typed_option<bool> local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<bool> local_d0;
  
  local_ad0 = options;
  dat = calloc_or_throw<active_cover>(1);
  dat->active_c0 = 0.0;
  dat->alpha = 0.0;
  dat->beta_scale = 0.0;
  dat->oracular = false;
  *(undefined3 *)&dat->field_0xd = 0;
  dat->cover_size = 0;
  dat->lambda_n = (float *)0x0;
  dat->lambda_d = (float *)0x0;
  dat->all = (vw *)0x0;
  dat->l = (base_learner *)0x0;
  local_898._0_8_ = (_func_int **)0x1a;
  local_ac0 = local_ab0;
  local_ac0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_ac0,(ulong)local_898);
  local_ab0[0] = (_func_int **)local_898._0_8_;
  builtin_strncpy((char *)((long)local_ac0 + 10),"rning wi",8);
  builtin_strncpy((char *)((long)local_ac0 + 0x12),"th Cover",8);
  *(undefined4 *)local_ac0 = 0x69746341;
  builtin_strncpy((char *)((long)local_ac0 + 4),"ve L",4);
  *(undefined4 *)(local_ac0 + 1) = 0x6e726165;
  builtin_strncpy((char *)((long)local_ac0 + 0xc),"ing ",4);
  local_ab8 = (_func_int **)local_898._0_8_;
  *(char *)((long)local_ac0 + local_898._0_8_) = '\0';
  local_970.m_name._M_dataplus._M_p = (pointer)&local_970.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_970,local_ac0,(char *)(local_898._0_8_ + (long)local_ac0));
  local_970.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_970.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_970.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_ac0 != local_ab0) {
    operator_delete(local_ac0);
  }
  local_ad1 = false;
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  local_990.field_2._M_allocated_capacity = 0x635f657669746361;
  local_990.field_2._8_4_ = 0x7265766f;
  local_990._M_string_length = 0xc;
  local_990.field_2._M_local_buf[0xc] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_898,&local_990,&local_ad1);
  local_828 = true;
  local_a30 = local_a20;
  local_490.super_base_option._vptr_base_option = (_func_int **)0x21;
  local_a30 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a30,(ulong)&local_490);
  local_a20[0] = local_490.super_base_option._vptr_base_option;
  local_a30[2] = (_func_int **)0x7720676e696e7261;
  local_a30[3] = (_func_int **)0x65766f6320687469;
  *local_a30 = (_func_int **)0x6120656c62616e65;
  local_a30[1] = (_func_int **)0x656c206576697463;
  *(char *)(local_a30 + 4) = 'r';
  local_a28 = local_490.super_base_option._vptr_base_option;
  *(char *)((long)local_a30 + (long)local_490.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign(local_868);
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_898);
  poVar3 = VW::config::option_group_definition::add<bool>(&local_970,&local_d0);
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  local_9b0.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_9b0.field_2._8_2_ = 0x7373;
  local_9b0._M_string_length = 10;
  local_9b0.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_490,&local_9b0,&dat->active_c0);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_490,8.0);
  local_a50 = local_a40;
  local_530.super_base_option._vptr_base_option = (_func_int **)0x34;
  local_a50 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a50,(ulong)&local_530);
  local_a40[0] = local_530.super_base_option._vptr_base_option;
  local_a50[4] = (_func_int **)0x305f632072657465;
  local_a50[5] = (_func_int **)0x6c7561666544202e;
  local_a50[2] = (_func_int **)0x656e776f6c6c656d;
  local_a50[3] = (_func_int **)0x6d61726170207373;
  *local_a50 = (_func_int **)0x6c20657669746361;
  local_a50[1] = (_func_int **)0x20676e696e726165;
  *(undefined4 *)(local_a50 + 6) = 0x2e382074;
  local_a48 = local_530.super_base_option._vptr_base_option;
  *(char *)((long)local_a50 + (long)local_530.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_170);
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  local_9d0.field_2._M_allocated_capacity._0_4_ = 0x68706c61;
  local_9d0.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_9d0._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_530,&local_9d0,&dat->alpha);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_530,1.0);
  local_a70 = local_a60;
  local_5d0.super_base_option._vptr_base_option = (_func_int **)0x40;
  local_a70 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a70,(ulong)&local_5d0);
  local_a60[0] = local_5d0.super_base_option._vptr_base_option;
  local_a70[6] = (_func_int **)0x6544202e6168706c;
  local_a70[7] = (_func_int **)0x2e3120746c756166;
  local_a70[4] = (_func_int **)0x72617020646e756f;
  local_a70[5] = (_func_int **)0x6120726574656d61;
  local_a70[2] = (_func_int **)0x65636e6169726176;
  local_a70[3] = (_func_int **)0x6220726570707520;
  *local_a70 = (_func_int **)0x6c20657669746361;
  local_a70[1] = (_func_int **)0x20676e696e726165;
  local_a68 = local_5d0.super_base_option._vptr_base_option;
  *(char *)((long)local_a70 + (long)local_5d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_210);
  local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
  local_9f0.field_2._M_allocated_capacity = 0x6163735f61746562;
  local_9f0.field_2._8_2_ = 0x656c;
  local_9f0._M_string_length = 10;
  local_9f0.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_5d0,&local_9f0,&dat->beta_scale);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_5d0,3.1622777);
  local_a90 = local_a80;
  local_670.super_base_option._vptr_base_option = (_func_int **)0x4c;
  local_aa0 = all;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a90,(ulong)&local_670);
  pp_Var1 = local_670.super_base_option._vptr_base_option;
  local_a80[0] = local_670.super_base_option._vptr_base_option;
  local_a90 = __dest;
  memcpy(__dest,"active learning variance upper bound parameter beta_scale. Default sqrt(10).",0x4c)
  ;
  local_a88 = pp_Var1;
  *(undefined1 *)((long)__dest + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_2b0,ptVar4);
  poVar3 = VW::config::option_group_definition::add<float>(poVar3,&local_2b0);
  local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
  local_a10.field_2._M_allocated_capacity._0_4_ = 0x65766f63;
  local_a10.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_a10._M_string_length = 5;
  local_ac8 = &dat->cover_size;
  VW::config::typed_option<unsigned_long>::typed_option(&local_670,&local_a10,local_ac8);
  all_00 = local_aa0;
  local_670.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<unsigned_long>::default_value(&local_670,0xc);
  local_710._0_8_ = (_func_int **)0x17;
  local_918 = local_908;
  local_918 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_918,(ulong)local_710);
  local_908[0] = (_func_int **)local_710._0_8_;
  *local_918 = (_func_int **)0x6973207265766f63;
  local_918[1] = (_func_int **)0x61666544202e657a;
  builtin_strncpy((char *)((long)local_918 + 0xf),"ault 12.",8);
  local_910 = (_func_int **)local_710._0_8_;
  *(char *)((long)local_918 + local_710._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_350,ptVar5);
  poVar3 = VW::config::option_group_definition::add<unsigned_long>(poVar3,&local_350);
  local_8f8.field_2._M_allocated_capacity = 0x72616c756361726f;
  local_8f8._M_string_length = 8;
  local_8f8.field_2._M_local_buf[8] = '\0';
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_710,&local_8f8,&dat->oracular);
  local_a98 = 0x33;
  local_938 = local_928;
  local_938 = (long *)std::__cxx11::string::_M_create((ulong *)&local_938,(ulong)&local_a98);
  local_928[0] = local_a98;
  local_938[4] = 0x666544202e746f6e;
  local_938[5] = 0x6c616620746c7561;
  local_938[2] = 0x7120656c79747320;
  local_938[3] = 0x20726f2079726575;
  *local_938 = 0x6361724f20657355;
  local_938[1] = 0x4c41432d72616c75;
  builtin_strncpy((char *)((long)local_938 + 0x2f),"lse.",4);
  local_930 = local_a98;
  *(char *)((long)local_938 + local_a98) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3f0,(typed_option<bool> *)local_710);
  VW::config::option_group_definition::add<bool>(poVar3,&local_3f0);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd018;
  if (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_938 != local_928) {
    operator_delete(local_938);
  }
  local_710._0_8_ = &PTR__typed_option_002cd018;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0b8;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_918 != local_908) {
    operator_delete(local_918);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0b8;
  if (local_670.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_a90 != local_a80) {
    operator_delete(local_a90);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_a70 != local_a60) {
    operator_delete(local_a70);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_a50 != local_a40) {
    operator_delete(local_a50);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd018;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_a30 != local_a20) {
    operator_delete(local_a30);
  }
  local_898._0_8_ = &PTR__typed_option_002cd018;
  if (local_800._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_800._M_pi);
  }
  if (local_810._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_810._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_898);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p);
  }
  (**local_ad0->_vptr_options_i)(local_ad0,&local_970);
  if (local_ad1 == false) {
    plVar8 = (learner<active_cover,_example> *)0x0;
  }
  else {
    dat->all = all_00;
    dat->beta_scale = dat->beta_scale * dat->beta_scale;
    if (dat->oracular == true) {
      *local_ac8 = 0;
    }
    pp_Var1 = (_func_int **)(local_898 + 0x10);
    local_898._16_4_ = 0x61646c;
    local_898._8_8_ = (pointer)0x3;
    local_898._0_8_ = pp_Var1;
    iVar2 = (*local_ad0->_vptr_options_i[1])(local_ad0,local_898);
    if ((_func_int **)local_898._0_8_ != pp_Var1) {
      operator_delete((void *)local_898._0_8_);
    }
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_898);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_898 + 0x10),"error: you can\'t combine lda and active learning",
                 0x30);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x101,&local_8b8);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_898._16_4_ = 0x69746361;
    local_884 = 0x6576;
    local_898._8_8_ = (pointer)0x6;
    local_882 = 0;
    local_898._0_8_ = pp_Var1;
    iVar2 = (*local_ad0->_vptr_options_i[1])();
    if ((_func_int **)local_898._0_8_ != pp_Var1) {
      operator_delete((void *)local_898._0_8_);
    }
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_898);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_898 + 0x10),
                 "error: you can\'t use --active_cover and --active at the same time",0x41);
      pvVar9 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar9,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x104,&local_8d8);
      __cxa_throw(pvVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    l = setup_base(local_ad0,all_00);
    base = LEARNER::as_singleline<char,char>(l);
    pfVar6 = (float *)operator_new__(-(ulong)(*local_ac8 >> 0x3e != 0) | *local_ac8 << 2);
    dat->lambda_n = pfVar6;
    uVar10 = 0xffffffffffffffff;
    if (dat->cover_size < 0x4000000000000000) {
      uVar10 = dat->cover_size * 4;
    }
    pfVar6 = (float *)operator_new__(uVar10);
    dat->lambda_d = pfVar6;
    uVar10 = dat->cover_size;
    if (uVar10 != 0) {
      uVar7 = 0;
      do {
        dat->lambda_n[uVar7] = 0.0;
        dat->lambda_d[uVar7] = 0.125;
        uVar7 = uVar7 + 1;
        uVar10 = dat->cover_size;
      } while (uVar7 < uVar10);
    }
    plVar8 = LEARNER::learner<active_cover,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn_active_cover<true>,
                        predict_or_learn_active_cover<false>,uVar10 + 1,
                        *(prediction_type_t *)(base + 0xd0));
    *(undefined8 *)(plVar8 + 0xb8) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0xc0) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 200) = finish;
    dat = (active_cover *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_970.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_name._M_dataplus._M_p != &local_970.m_name.field_2) {
    operator_delete(local_970.m_name._M_dataplus._M_p);
  }
  if (dat != (active_cover *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar8;
}

Assistant:

base_learner* active_cover_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active_cover>();
  option_group_definition new_options("Active Learning with Cover");

  bool active_cover_option = false;
  new_options.add(make_option("active_cover", active_cover_option).keep().help("enable active learning with cover"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8."))
      .add(make_option("alpha", data->alpha)
               .default_value(1.f)
               .help("active learning variance upper bound parameter alpha. Default 1."))
      .add(make_option("beta_scale", data->beta_scale)
               .default_value(sqrtf(10.f))
               .help("active learning variance upper bound parameter beta_scale. Default sqrt(10)."))
      .add(make_option("cover", data->cover_size).keep().default_value(12).help("cover size. Default 12."))
      .add(make_option("oracular", data->oracular).help("Use Oracular-CAL style query or not. Default false."));
  options.add_and_parse(new_options);

  if (!active_cover_option)
    return nullptr;

  data->all = &all;
  data->beta_scale *= data->beta_scale;

  if (data->oracular)
    data->cover_size = 0;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --active_cover and --active at the same time");

  auto base = as_singleline(setup_base(options, all));

  data->lambda_n = new float[data->cover_size];
  data->lambda_d = new float[data->cover_size];

  for (size_t i = 0; i < data->cover_size; i++)
  {
    data->lambda_n[i] = 0.f;
    data->lambda_d[i] = 1.f / 8.f;
  }

  // Create new learner
  learner<active_cover, example>& l = init_learner(
      data, base, predict_or_learn_active_cover<true>, predict_or_learn_active_cover<false>, data->cover_size + 1);
  l.set_finish(finish);

  return make_base(l);
}